

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse4.cpp
# Opt level: O0

void convertRGBA64FromRGBA64PM_sse4<true>(QRgba64 *buffer,QRgba64 *src,int count)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [16];
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  undefined1 auVar8 [12];
  undefined1 auVar9 [16];
  undefined1 auVar10 [12];
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 (*pauVar23) [16];
  ulong *puVar24;
  undefined8 *puVar25;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  float fVar27;
  undefined1 auVar26 [16];
  undefined8 extraout_XMM0_Qb;
  float fVar28;
  undefined1 auVar29 [16];
  __m128 afVar30;
  int _i;
  __m128i srcVector2AlphaMask;
  __m128i srcVector1AlphaMask;
  __m128 ia4;
  __m128 ia3;
  __m128 ia2;
  __m128 ia1;
  __m128i src4;
  __m128i src3;
  __m128i src2;
  __m128i src1;
  __m128 ia;
  __m128 a;
  __m128i srcVectorAlpha;
  __m128i srcVector2Alpha;
  __m128i srcVector1Alpha;
  bool opaque2;
  bool transparent2;
  bool opaque1;
  bool transparent1;
  __m128i srcVector2;
  __m128i srcVector1;
  __m128i zero;
  __m128i alphaMask;
  int i;
  QRgba64 v_1;
  QRgba64 v;
  undefined4 in_stack_fffffffffffff998;
  undefined4 in_stack_fffffffffffff99c;
  int local_63c;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  float local_598;
  float fStack_594;
  int local_4f0;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  uint uStack_2f4;
  uint uStack_2ec;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  uint uStack_2d4;
  uint uStack_2cc;
  uint uStack_2c4;
  uint uStack_2c0;
  uint uStack_2bc;
  int local_2b8;
  int iStack_2b4;
  ushort uStack_28e;
  ushort uStack_28c;
  ushort uStack_28a;
  ushort uStack_26e;
  ushort uStack_26c;
  ushort uStack_26a;
  ushort local_258;
  ushort uStack_256;
  ushort uStack_254;
  ushort uStack_252;
  ushort local_238;
  ushort uStack_236;
  ushort uStack_234;
  ushort uStack_232;
  QRgba64 local_20;
  QRgba64 local_18;
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_4f0 = 0;
  local_c = MXCSR;
  if ((MXCSR & 0x80) == 0) {
    for (; local_4f0 < in_EDX; local_4f0 = local_4f0 + 1) {
      local_18.rgba = (quint64)&DAT_aaaaaaaaaaaaaaaa;
      local_18 = QRgba64::unpremultiplied
                           ((QRgba64 *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)
                           );
      QRgba64::setAlpha(&local_18,0xffff);
      *(quint64 *)(in_RDI + (long)local_4f0 * 8) = local_18.rgba;
    }
  }
  else {
    for (; local_4f0 < in_EDX + -3; local_4f0 = local_4f0 + 4) {
      pauVar1 = (undefined1 (*) [16])(in_RSI + (long)local_4f0 * 8);
      uVar11 = *(ulong *)*pauVar1;
      uVar12 = *(ulong *)(*pauVar1 + 8);
      pauVar23 = (undefined1 (*) [16])(in_RSI + (long)(local_4f0 + 2) * 8);
      uVar13 = *(ulong *)*pauVar23;
      uVar14 = *(ulong *)(*pauVar23 + 8);
      auVar29._8_8_ = 0xffff000000000000;
      auVar29._0_8_ = 0xffff000000000000;
      auVar16._8_8_ = 0xffff000000000000;
      auVar16._0_8_ = 0xffff000000000000;
      auVar26._8_8_ = 0xffff000000000000;
      auVar26._0_8_ = 0xffff000000000000;
      auVar15._8_8_ = 0xffff000000000000;
      auVar15._0_8_ = 0xffff000000000000;
      if (((auVar29 & *pauVar1) == (undefined1  [16])0x0) &&
         ((auVar26 & *pauVar23) == (undefined1  [16])0x0)) {
        puVar25 = (undefined8 *)(in_RDI + (long)local_4f0 * 8);
        *puVar25 = 0;
        puVar25[1] = 0;
        puVar25 = (undefined8 *)(in_RDI + (long)(local_4f0 + 2) * 8);
        *puVar25 = 0;
        puVar25[1] = 0;
      }
      else if (((auVar16 & ~*pauVar1) == (undefined1  [16])0x0) &&
              ((auVar15 & ~*pauVar23) == (undefined1  [16])0x0)) {
        puVar24 = (ulong *)(in_RDI + (long)local_4f0 * 8);
        *puVar24 = uVar11 | 0xffff000000000000;
        puVar24[1] = uVar12 | 0xffff000000000000;
        puVar24 = (ulong *)(in_RDI + (long)(local_4f0 + 2) * 8);
        *puVar24 = uVar13 | 0xffff000000000000;
        puVar24[1] = uVar14 | 0xffff000000000000;
      }
      else {
        auVar22._8_8_ = uVar12 >> 0x30;
        auVar22._0_8_ = uVar11 >> 0x30;
        auVar21._8_8_ = uVar14 >> 0x30;
        auVar21._0_8_ = uVar13 >> 0x30;
        auVar26 = packusdw(auVar22,auVar21);
        in_stack_fffffffffffff998 = 0xffffffff;
        in_stack_fffffffffffff99c = 0xffffffff;
        local_2b8 = auVar26._0_4_;
        iStack_2b4 = auVar26._4_4_;
        afVar30[1] = (float)iStack_2b4;
        afVar30[0] = (float)local_2b8;
        afVar30[2] = 65535.0;
        afVar30[3] = 0.0;
        afVar30 = reciprocal_mul_ps(afVar30,6.72623e-44);
        fVar27 = (float)extraout_XMM0_Qb;
        fVar28 = (float)((ulong)extraout_XMM0_Qb >> 0x20);
        local_238 = (ushort)uVar11;
        uStack_236 = (ushort)(uVar11 >> 0x10);
        uStack_234 = (ushort)(uVar11 >> 0x20);
        uStack_232 = (ushort)(uVar11 >> 0x30);
        local_5a8._0_4_ = (uint)local_238;
        uStack_26e = (ushort)(uVar12 >> 0x10);
        uStack_26c = (ushort)(uVar12 >> 0x20);
        uStack_26a = (ushort)(uVar12 >> 0x30);
        uStack_5b0._0_4_ = (uint)uStack_26c;
        local_258 = (ushort)uVar13;
        uStack_256 = (ushort)(uVar13 >> 0x10);
        uStack_254 = (ushort)(uVar13 >> 0x20);
        uStack_252 = (ushort)(uVar13 >> 0x30);
        local_5c8._0_4_ = (uint)local_258;
        uStack_28e = (ushort)(uVar14 >> 0x10);
        uStack_28c = (ushort)(uVar14 >> 0x20);
        uStack_28a = (ushort)(uVar14 >> 0x30);
        uStack_5d0._0_4_ = (uint)uStack_28c;
        local_598 = afVar30[0];
        fStack_594 = afVar30[1];
        uStack_2c4 = (uint)uStack_236;
        uStack_2c0 = (uint)uStack_234;
        uStack_2bc = (uint)uStack_232;
        uVar3 = CONCAT26((short)((uint)(float)uStack_2c4 >> 0x10),
                         CONCAT24(SUB42((float)uStack_2c4,0),(float)(uint)local_5a8));
        auVar4._8_2_ = SUB42((float)uStack_2c0,0);
        auVar4._0_8_ = uVar3;
        auVar4._10_2_ = (short)((uint)(float)uStack_2c0 >> 0x10);
        auVar2._12_2_ = SUB42((float)uStack_2bc,0);
        auVar2._0_12_ = auVar4;
        auVar2._14_2_ = (short)((uint)(float)uStack_2bc >> 0x10);
        fStack_464 = (float)((ulong)uVar3 >> 0x20);
        fStack_460 = auVar4._8_4_;
        fStack_45c = auVar2._12_4_;
        local_5a8 = CONCAT44((int)(fStack_464 * local_598),(int)((float)(uint)local_5a8 * local_598)
                            );
        uStack_5a0._0_4_ = (int)(fStack_460 * local_598);
        uStack_5a0._4_4_ = (int)(fStack_45c * local_598);
        uStack_2d4 = (uint)uStack_26e;
        uStack_2cc = (uint)uStack_26a;
        uVar3 = CONCAT26((short)((uint)(float)uStack_2d4 >> 0x10),
                         CONCAT24(SUB42((float)uStack_2d4,0),(float)(ushort)uVar12));
        auVar6._8_2_ = SUB42((float)(uint)uStack_5b0,0);
        auVar6._0_8_ = uVar3;
        auVar6._10_2_ = (short)((uint)(float)(uint)uStack_5b0 >> 0x10);
        auVar5._12_2_ = SUB42((float)uStack_2cc,0);
        auVar5._0_12_ = auVar6;
        auVar5._14_2_ = (short)((uint)(float)uStack_2cc >> 0x10);
        fStack_484 = (float)((ulong)uVar3 >> 0x20);
        fStack_480 = auVar6._8_4_;
        fStack_47c = auVar5._12_4_;
        local_5b8 = CONCAT44((int)(fStack_484 * fStack_594),
                             (int)((float)(ushort)uVar12 * fStack_594));
        uStack_5b0 = CONCAT44((int)(fStack_47c * fStack_594),(int)(fStack_480 * fStack_594));
        uStack_2e4 = (uint)uStack_256;
        uStack_2e0 = (uint)uStack_254;
        uStack_2dc = (uint)uStack_252;
        uVar3 = CONCAT26((short)((uint)(float)uStack_2e4 >> 0x10),
                         CONCAT24(SUB42((float)uStack_2e4,0),(float)(uint)local_5c8));
        auVar8._8_2_ = SUB42((float)uStack_2e0,0);
        auVar8._0_8_ = uVar3;
        auVar8._10_2_ = (short)((uint)(float)uStack_2e0 >> 0x10);
        auVar7._12_2_ = SUB42((float)uStack_2dc,0);
        auVar7._0_12_ = auVar8;
        auVar7._14_2_ = (short)((uint)(float)uStack_2dc >> 0x10);
        fStack_4a4 = (float)((ulong)uVar3 >> 0x20);
        fStack_4a0 = auVar8._8_4_;
        fStack_49c = auVar7._12_4_;
        local_5c8 = CONCAT44((int)(fStack_4a4 * fVar27),(int)((float)(uint)local_5c8 * fVar27));
        uStack_5c0._0_4_ = (int)(fStack_4a0 * fVar27);
        uStack_5c0._4_4_ = (int)(fStack_49c * fVar27);
        uStack_2f4 = (uint)uStack_28e;
        uStack_2ec = (uint)uStack_28a;
        uVar3 = CONCAT26((short)((uint)(float)uStack_2f4 >> 0x10),
                         CONCAT24(SUB42((float)uStack_2f4,0),(float)(ushort)uVar14));
        auVar10._8_2_ = SUB42((float)(uint)uStack_5d0,0);
        auVar10._0_8_ = uVar3;
        auVar10._10_2_ = (short)((uint)(float)(uint)uStack_5d0 >> 0x10);
        auVar9._12_2_ = SUB42((float)uStack_2ec,0);
        auVar9._0_12_ = auVar10;
        auVar9._14_2_ = (short)((uint)(float)uStack_2ec >> 0x10);
        fStack_4c4 = (float)((ulong)uVar3 >> 0x20);
        fStack_4c0 = auVar10._8_4_;
        fStack_4bc = auVar9._12_4_;
        local_5d8 = CONCAT44((int)(fStack_4c4 * fVar28),(int)((float)(ushort)uVar14 * fVar28));
        uStack_5d0 = CONCAT44((int)(fStack_4bc * fVar28),(int)(fStack_4c0 * fVar28));
        auVar20._8_8_ = uStack_5a0;
        auVar20._0_8_ = local_5a8;
        auVar19._8_8_ = uStack_5b0;
        auVar19._0_8_ = local_5b8;
        auVar26 = packusdw(auVar20,auVar19);
        auVar18._8_8_ = uStack_5c0;
        auVar18._0_8_ = local_5c8;
        auVar17._8_8_ = uStack_5d0;
        auVar17._0_8_ = local_5d8;
        auVar29 = packusdw(auVar18,auVar17);
        local_5a8 = auVar26._0_8_;
        uStack_5a0 = auVar26._8_8_;
        local_5c8 = auVar29._0_8_;
        uStack_5c0 = auVar29._8_8_;
        puVar24 = (ulong *)(in_RDI + (long)local_4f0 * 8);
        *puVar24 = ~-(ulong)(uVar11 >> 0x30 == 0) & local_5a8 | 0xffff000000000000;
        puVar24[1] = ~-(ulong)(uVar12 >> 0x30 == 0) & uStack_5a0 | 0xffff000000000000;
        puVar24 = (ulong *)(in_RDI + (long)(local_4f0 + 2) * 8);
        *puVar24 = (-(ulong)(uVar13 >> 0x30 == 0) ^
                   CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)) & local_5c8 |
                   0xffff000000000000;
        puVar24[1] = (-(ulong)(uVar14 >> 0x30 == 0) ^ 0xffffffffffffffff) & uStack_5c0 |
                     0xffff000000000000;
      }
    }
    for (local_63c = 0; local_63c < 3 && local_4f0 < in_EDX; local_63c = local_63c + 1) {
      local_20.rgba = (quint64)&DAT_aaaaaaaaaaaaaaaa;
      local_20 = QRgba64::unpremultiplied
                           ((QRgba64 *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)
                           );
      QRgba64::setAlpha(&local_20,0xffff);
      *(quint64 *)(in_RDI + (long)local_4f0 * 8) = local_20.rgba;
      local_4f0 = local_4f0 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void convertRGBA64FromRGBA64PM_sse4(QRgba64 *buffer, const QRgba64 *src, int count)
{
    int i = 0;
    if ((_MM_GET_EXCEPTION_MASK() & _MM_MASK_INVALID) == 0) {
        for (; i < count; ++i) {
            QRgba64 v = src[i].unpremultiplied();
            if (mask)
                v.setAlpha(65535);
            buffer[i] = v;
        }
        return;
    }
    const __m128i alphaMask = _mm_set1_epi64x(qint64(Q_UINT64_C(0xffff) << 48));
    const __m128i zero = _mm_setzero_si128();

    for (; i < count - 3; i += 4) {
        __m128i srcVector1 = _mm_loadu_si128((const __m128i *)&src[i + 0]);
        __m128i srcVector2 = _mm_loadu_si128((const __m128i *)&src[i + 2]);
        bool transparent1 = _mm_testz_si128(srcVector1, alphaMask);
        bool opaque1 = _mm_testc_si128(srcVector1, alphaMask);
        bool transparent2 = _mm_testz_si128(srcVector2, alphaMask);
        bool opaque2 = _mm_testc_si128(srcVector2, alphaMask);

        if (!(transparent1 && transparent2)) {
            if (!(opaque1 && opaque2)) {
                __m128i srcVector1Alpha = _mm_srli_epi64(srcVector1, 48);
                __m128i srcVector2Alpha = _mm_srli_epi64(srcVector2, 48);
                __m128i srcVectorAlpha = _mm_packus_epi32(srcVector1Alpha, srcVector2Alpha);
                const __m128 a = _mm_cvtepi32_ps(srcVectorAlpha);
                const __m128 ia = reciprocal_mul_ps(a, 65535.0f);
                __m128i src1 = _mm_unpacklo_epi16(srcVector1, zero);
                __m128i src2 = _mm_unpackhi_epi16(srcVector1, zero);
                __m128i src3 = _mm_unpacklo_epi16(srcVector2, zero);
                __m128i src4 = _mm_unpackhi_epi16(srcVector2, zero);
                __m128 ia1 = _mm_shuffle_ps(ia, ia, _MM_SHUFFLE(0, 0, 0, 0));
                __m128 ia2 = _mm_shuffle_ps(ia, ia, _MM_SHUFFLE(1, 1, 1, 1));
                __m128 ia3 = _mm_shuffle_ps(ia, ia, _MM_SHUFFLE(2, 2, 2, 2));
                __m128 ia4 = _mm_shuffle_ps(ia, ia, _MM_SHUFFLE(3, 3, 3, 3));
                src1 = _mm_cvtps_epi32(_mm_mul_ps(_mm_cvtepi32_ps(src1), ia1));
                src2 = _mm_cvtps_epi32(_mm_mul_ps(_mm_cvtepi32_ps(src2), ia2));
                src3 = _mm_cvtps_epi32(_mm_mul_ps(_mm_cvtepi32_ps(src3), ia3));
                src4 = _mm_cvtps_epi32(_mm_mul_ps(_mm_cvtepi32_ps(src4), ia4));
                src1 = _mm_packus_epi32(src1, src2);
                src3 = _mm_packus_epi32(src3, src4);
                // Handle potential alpha == 0 values:
                __m128i srcVector1AlphaMask = _mm_cmpeq_epi64(srcVector1Alpha, zero);
                __m128i srcVector2AlphaMask = _mm_cmpeq_epi64(srcVector2Alpha, zero);
                src1 = _mm_andnot_si128(srcVector1AlphaMask, src1);
                src3 = _mm_andnot_si128(srcVector2AlphaMask, src3);
                // Fixup alpha values:
                if (mask) {
                    src1 = _mm_or_si128(src1, alphaMask);
                    src3 = _mm_or_si128(src3, alphaMask);
                } else {
                    src1 = _mm_blendv_epi8(src1, srcVector1, alphaMask);
                    src3 = _mm_blendv_epi8(src3, srcVector2, alphaMask);
                }
                _mm_storeu_si128((__m128i *)&buffer[i + 0], src1);
                _mm_storeu_si128((__m128i *)&buffer[i + 2], src3);
            } else {
                if (mask) {
                    srcVector1 = _mm_or_si128(srcVector1, alphaMask);
                    srcVector2 = _mm_or_si128(srcVector2, alphaMask);
                }
                if (mask || src != buffer) {
                    _mm_storeu_si128((__m128i *)&buffer[i + 0], srcVector1);
                    _mm_storeu_si128((__m128i *)&buffer[i + 2], srcVector2);
                }
            }
        } else {
            _mm_storeu_si128((__m128i *)&buffer[i + 0], zero);
            _mm_storeu_si128((__m128i *)&buffer[i + 2], zero);
        }
    }

    SIMD_EPILOGUE(i, count, 3) {
        QRgba64 v = src[i].unpremultiplied();
        if (mask)
            v.setAlpha(65535);
        buffer[i] = v;
    }
}